

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basewindow_x11.cc
# Opt level: O1

void __thiscall bgui::BaseWindow::getContent(BaseWindow *this,ImageU8 *image)

{
  int iVar1;
  XImage *pXVar2;
  char *pcVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  BaseWindowData *pBVar7;
  byte bVar8;
  byte bVar9;
  ulong uVar10;
  int iVar11;
  BaseWindowData *pBVar12;
  ulong uVar13;
  long lVar14;
  uint uVar15;
  ulong uVar16;
  ulong uVar17;
  
  pXVar2 = this->p->image;
  uVar15 = 0xfffffffe;
  do {
    uVar4 = uVar15 + 2;
    uVar15 = uVar15 + 1;
    if (0x1f < uVar4) break;
  } while (((long)(1 << ((byte)uVar4 & 0x1f)) & pXVar2->red_mask) == 0);
  do {
    uVar15 = uVar15 + 1;
    if (0x1f < uVar15) break;
  } while (((long)(1 << ((byte)uVar15 & 0x1f)) & pXVar2->red_mask) != 0);
  if (0x1f < uVar15) {
    uVar15 = 0;
  }
  bVar8 = (char)uVar15 - 8;
  if (uVar15 < 8) {
    bVar8 = 0;
  }
  uVar4 = 0xfffffffe;
  do {
    uVar5 = uVar4 + 2;
    uVar4 = uVar4 + 1;
    if (0x1f < uVar5) break;
  } while (((long)(1 << ((byte)uVar5 & 0x1f)) & pXVar2->green_mask) == 0);
  do {
    uVar4 = uVar4 + 1;
    if (0x1f < uVar4) break;
  } while (((long)(1 << ((byte)uVar4 & 0x1f)) & pXVar2->green_mask) != 0);
  if (0x1f < uVar4) {
    uVar4 = 0;
  }
  bVar9 = (char)uVar4 - 8;
  if (uVar4 < 8) {
    bVar9 = 0;
  }
  uVar5 = 0xfffffffe;
  do {
    uVar6 = uVar5 + 2;
    uVar5 = uVar5 + 1;
    if (0x1f < uVar6) break;
  } while (((long)(1 << ((byte)uVar6 & 0x1f)) & pXVar2->blue_mask) == 0);
  do {
    uVar5 = uVar5 + 1;
    if (0x1f < uVar5) break;
  } while (((long)(1 << ((byte)uVar5 & 0x1f)) & pXVar2->blue_mask) != 0);
  pthread_mutex_lock((pthread_mutex_t *)&this->p->mutex);
  gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::setSize
            (image,(long)this->p->w,(long)this->p->h,3);
  pBVar12 = this->p;
  if (0 < pBVar12->h) {
    uVar13 = 0;
    if (0x1f < uVar5) {
      uVar5 = 0;
    }
    uVar6 = uVar5 - 8;
    if (uVar5 < 8) {
      uVar6 = 0;
    }
    uVar10 = (ulong)-(uVar5 - 8);
    if (7 < uVar5) {
      uVar10 = uVar13;
    }
    uVar17 = (ulong)(8 - uVar4);
    if (7 < uVar4) {
      uVar17 = uVar13;
    }
    uVar16 = (ulong)(8 - uVar15);
    if (7 < uVar15) {
      uVar16 = uVar13;
    }
    do {
      pBVar7 = this->p;
      if (0 < pBVar7->w) {
        iVar11 = pBVar12->image->bytes_per_line * (int)uVar13;
        pcVar3 = pBVar12->image->data;
        lVar14 = 0;
        do {
          iVar1 = pBVar7->image->bitmap_unit;
          if (iVar1 == 0x20) {
            uVar15 = *(uint *)(pcVar3 + lVar14 * 4 + (long)iVar11);
          }
          else if (iVar1 == 0x10) {
            uVar15 = (uint)*(ushort *)(pcVar3 + lVar14 * 2 + (long)iVar11);
          }
          else {
            uVar15 = 0;
            if (iVar1 == 8) {
              uVar15 = (uint)(byte)pcVar3[lVar14 + iVar11];
            }
          }
          (*image->img)[uVar13][lVar14] =
               (uchar)(((ulong)((uint)pBVar7->image->red_mask & uVar15) << ((byte)uVar16 & 0x3f)) >>
                      (bVar8 & 0x3f));
          image->img[1][uVar13][lVar14] =
               (uchar)(((ulong)((uint)this->p->image->green_mask & uVar15) << ((byte)uVar17 & 0x3f))
                      >> (bVar9 & 0x3f));
          image->img[2][uVar13][lVar14] =
               (uchar)(((ulong)(uVar15 & (uint)this->p->image->blue_mask) << ((byte)uVar10 & 0x3f))
                      >> ((byte)uVar6 & 0x3f));
          lVar14 = lVar14 + 1;
          pBVar7 = this->p;
        } while (lVar14 < pBVar7->w);
      }
      uVar13 = uVar13 + 1;
      pBVar12 = this->p;
    } while ((long)uVar13 < (long)pBVar12->h);
  }
  pthread_mutex_unlock((pthread_mutex_t *)&pBVar12->mutex);
  return;
}

Assistant:

void BaseWindow::getContent(gimage::ImageU8 &image)
{
  int rls, rrs;
  int gls, grs;
  int bls, brs;

  // store image in buffer

  getShiftFromMask(p->image->red_mask, rls, rrs);
  getShiftFromMask(p->image->green_mask, gls, grs);
  getShiftFromMask(p->image->blue_mask, bls, brs);

  pthread_mutex_lock(&(p->mutex));

  image.setSize(p->w, p->h, 3);

  for (int k=0; k<p->h; k++)
  {
    char *line=p->image->data+k*p->image->bytes_per_line;

    for (int i=0; i<p->w; i++)
    {
      uint32_t v=0;

      switch (p->image->bitmap_unit)
      {
        case 8:
          v=reinterpret_cast<uint8_t *>(line)[i];
          break;

        case 16:
          v=reinterpret_cast<uint16_t *>(line)[i];
          break;

        case 32:
          v=reinterpret_cast<uint32_t *>(line)[i];
          break;
      }

      image.set(i, k, 0, inverseShiftAndMaskValue(v, rls, rrs, p->image->red_mask));
      image.set(i, k, 1, inverseShiftAndMaskValue(v, gls, grs, p->image->green_mask));
      image.set(i, k, 2, inverseShiftAndMaskValue(v, bls, brs, p->image->blue_mask));
    }
  }

  pthread_mutex_unlock(&(p->mutex));
}